

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# postproc_filters_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::PostprocFiltersTestLarge_MD5Match_Test::
~PostprocFiltersTestLarge_MD5Match_Test(PostprocFiltersTestLarge_MD5Match_Test *this)

{
  anon_unknown.dwarf_13075bd::PostprocFiltersTest::~PostprocFiltersTest
            ((PostprocFiltersTest *)(this + -0x18));
  return;
}

Assistant:

TEST_P(PostprocFiltersTestLarge, MD5Match) { DoTest(); }